

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree_mpi_io.c
# Opt level: O2

int kvtree_write_gather(char *prefix,kvtree *data,MPI_Comm comm)

{
  mode_t mVar1;
  int fd;
  int iVar2;
  size_t sVar3;
  kvtree *pkVar4;
  kvtree *recv_00;
  unsigned_long uVar5;
  ssize_t sVar6;
  MPI_Comm in_R8;
  MPI_Comm in_R9;
  int rank_world;
  int ranks_world;
  kvtree *recv;
  kvtree *save;
  kvtree *send;
  int allranks;
  int writer;
  size_t bufsize;
  void *buf;
  char mappath [1024];
  char mapfile [1024];
  
  MPI_Comm_rank(comm,&rank_world);
  MPI_Comm_size(comm,&ranks_world);
  sVar3 = kvtree_pack_size(data);
  pick_writer((int)sVar3,(unsigned_long)&writer,&allranks,(int *)comm,in_R8);
  pkVar4 = kvtree_new();
  send = pkVar4;
  recv_00 = kvtree_new();
  recv = recv_00;
  kvtree_exchange_sendq(pkVar4,writer,data);
  kvtree_exchange_direction(pkVar4,recv_00,comm,KVTREE_EXCHANGE_LEFT);
  pkVar4 = kvtree_new();
  save = pkVar4;
  if (rank_world == writer) {
    kvtree_set(pkVar4,"RANK",recv_00);
    recv = (kvtree *)0x0;
  }
  kvtree_delete(&recv);
  kvtree_delete(&send);
  snprintf(mapfile,0x400,".0.%d",(ulong)(uint)writer);
  snprintf(mappath,0x400,"%s%s",prefix,mapfile);
  uVar5 = kvtree_write_gather_map(prefix,mapfile,1,(uint)(rank_world == writer),(int)comm,in_R9);
  iVar2 = (int)uVar5;
  if (rank_world == writer) {
    mVar1 = kvtree_getmode(1,1,0);
    fd = kvtree_open(mappath,0x241,(ulong)mVar1);
    if (fd < 0) {
      kvtree_err("Opening file for write: %s @ %s:%d",mappath,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ECP-VeloC[P]KVTree/src/kvtree_mpi_io.c"
                 ,0x16a);
      iVar2 = 1;
    }
    else {
      kvtree_util_set_int(pkVar4,"LEVEL",0);
      kvtree_util_set_int(pkVar4,"RANKS",ranks_world);
      kvtree_write_persist(&buf,&bufsize,pkVar4);
      kvtree_lseek(mappath,fd,0,0);
      sVar6 = kvtree_write_attempt(mappath,fd,buf,bufsize);
      if (sVar6 < 0) {
        iVar2 = 1;
      }
      kvtree_free(&buf);
      kvtree_close(mappath,fd);
    }
  }
  kvtree_delete(&save);
  iVar2 = kvtree_alltrue((uint)(iVar2 == 0),comm);
  return (int)(iVar2 == 0);
}

Assistant:

int kvtree_write_gather(
  const char* prefix,
  kvtree* data,
  MPI_Comm comm)
{
  int rc = KVTREE_SUCCESS;

  /* get name of this process */
  int rank_world, ranks_world;
  MPI_Comm_rank(comm, &rank_world);
  MPI_Comm_size(comm, &ranks_world);

  /* pick our writer so that we send roughly 1MB of data to each */
  int writer, allranks;
  unsigned long pack_size = (unsigned long) kvtree_pack_size(data);
  pick_writer(1, pack_size, &writer, &allranks, comm);

  /* create send and receive hashes */
  kvtree* send = kvtree_new();
  kvtree* recv = kvtree_new();

  /* copy data into send hash */
  kvtree_exchange_sendq(send, writer, data);

  /* gather hashes to writers */
  kvtree_exchange_direction(send, recv, comm, KVTREE_EXCHANGE_LEFT);

  /* persist received hash */
  kvtree* save = kvtree_new();
  if (rank_world == writer) {
    /* record hash containing file names indexed by rank,
     * attach received hash to save hash and set recv to NULL
     * since we no longer need to free it */
    kvtree_set(save, "RANK", recv);
    recv = NULL;
  }

  /* free our hash data */
  kvtree_delete(&recv);
  kvtree_delete(&send);

  /* define file name */
  char mapfile[1024];
  char mappath[1024];
  snprintf(mapfile, sizeof(mapfile), ".0.%d", writer);
  snprintf(mappath, sizeof(mappath), "%s%s", prefix, mapfile);

  /* write map to files */
  unsigned long offset = 0;
  int level = 1;
  int valid = 0;
  if (rank_world == writer) {
    valid = 1;
  }
  if (kvtree_write_gather_map(prefix, mapfile, offset, level, valid, comm) != KVTREE_SUCCESS)
  {
    rc = KVTREE_FAILURE;
  }

  /* write blocks of summary data */
  if (rank_world == writer) {
    /* open the file if we need to */
    mode_t mode = kvtree_getmode(1, 1, 0);
    int fd = kvtree_open(mappath, O_WRONLY | O_CREAT | O_TRUNC, mode);
    if (fd >= 0) {
      /* store level value in hash */
      kvtree_util_set_int(save, "LEVEL", 0);

      /* record global number of ranks */
      kvtree_util_set_int(save, "RANKS", ranks_world);

      /* persist and compress hash */
      void* buf;
      size_t bufsize;
      kvtree_write_persist(&buf, &bufsize, save);

      /* write data to file */
      kvtree_lseek(mappath, fd, offset, SEEK_SET);
      ssize_t write_rc = kvtree_write_attempt(mappath, fd, buf, bufsize);
      if (write_rc < 0) {
        rc = KVTREE_FAILURE;
      }

      /* free memory */
      kvtree_free(&buf);

      /* close the file */
      kvtree_close(mappath, fd);
    } else {
      kvtree_err( "Opening file for write: %s @ %s:%d",
        mappath, __FILE__, __LINE__
      );
      rc = KVTREE_FAILURE;
    }
  }

  /* free the hash */
  kvtree_delete(&save);

  /* determine whether everyone wrote their files ok */
  if (kvtree_alltrue(rc == KVTREE_SUCCESS, comm)) {
    return KVTREE_SUCCESS;
  }
  return KVTREE_FAILURE;
}